

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTextureUtil.cpp
# Opt level: O3

UVec4 tcu::getTextureBorderColorUint(TextureFormat *format,Sampler *sampler)

{
  ChannelOrder CVar1;
  int c;
  TextureSwizzle *pTVar2;
  long lVar3;
  ChannelOrder CVar4;
  long in_RCX;
  ChannelType in_EDX;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  UVec4 UVar7;
  IVec4 channelBits;
  ChannelOrder local_48;
  uint uStack_44;
  uint uStack_40;
  uint uStack_3c;
  uint local_38;
  uint uStack_34;
  uint uStack_30;
  uint uStack_2c;
  
  pTVar2 = getBorderColorReadSwizzle((ChannelOrder)sampler);
  getChannelBitDepth(in_EDX);
  auVar5._0_4_ = (int)(float)(local_38 * 0x800000 + 0x3f800000);
  auVar5._4_4_ = (int)(float)(uStack_34 * 0x800000 + 0x3f800000);
  auVar5._8_4_ = (int)(float)(uStack_30 * 0x800000 + 0x3f800000);
  auVar5._12_4_ = (int)(float)(uStack_2c * 0x800000 + 0x3f800000);
  auVar6._4_4_ = auVar5._4_4_;
  auVar6._0_4_ = auVar5._4_4_;
  auVar6._8_4_ = auVar5._12_4_;
  auVar6._12_4_ = auVar5._12_4_;
  local_48 = (-(uint)((int)(local_38 ^ 0x80000000) < -0x7fffffe0) ^ ~R | -auVar5._0_4_ ^ ~R) &
             -(uint)(0 < (int)local_38);
  uStack_44 = (-(uint)((int)(uStack_34 ^ 0x80000000) < -0x7fffffe0) ^ 0xffffffff |
              -auVar5._4_4_ ^ 0xffffffffU) & -(uint)(0 < (int)uStack_34);
  uStack_40 = (-(uint)((int)(uStack_30 ^ 0x80000000) < -0x7fffffe0) ^ 0xffffffff |
              (uint)((auVar5._8_8_ & 0xffffffff) * 0xffffffff) ^ 0xffffffff) &
              -(uint)(0 < (int)uStack_30);
  uStack_3c = (-(uint)((int)(uStack_2c ^ 0x80000000) < -0x7fffffe0) ^ 0xffffffff |
              (uint)((auVar6._8_8_ & 0xffffffff) * 0xffffffff) ^ 0xffffffff) &
              -(uint)(0 < (int)uStack_2c);
  *(undefined1 (*) [16])format = (undefined1  [16])0x0;
  lVar3 = 0;
  do {
    UVar7.m_data._8_8_ = (long)(int)pTVar2->components[lVar3];
    CVar4 = R;
    if (UVar7.m_data._8_8_ != 4) {
      if (pTVar2->components[lVar3] == CHANNEL_ONE) {
        CVar4 = A;
      }
      else {
        CVar1 = *(ChannelOrder *)(in_RCX + 0x24 + UVar7.m_data._8_8_ * 4);
        CVar4 = (&local_48)[UVar7.m_data._8_8_];
        if (CVar1 < (&local_48)[UVar7.m_data._8_8_]) {
          CVar4 = CVar1;
        }
      }
    }
    (&format->order)[lVar3] = CVar4;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 4);
  UVar7.m_data[0] = 4;
  UVar7.m_data[1] = 0;
  return (UVec4)UVar7.m_data;
}

Assistant:

static tcu::UVec4 getTextureBorderColorUint (const TextureFormat& format, const Sampler& sampler)
{
	const tcu::TextureChannelClass	channelClass	= getTextureChannelClass(format.type);
	const TextureSwizzle::Channel*	channelMap		= getBorderColorReadSwizzle(format.order).components;
	const IVec4						channelBits		= getChannelBitDepth(format.type);
	const UVec4						valueMax		= getNBitUnsignedIntegerVec4MaxValue(channelBits);
	UVec4							result;

	DE_ASSERT(channelClass == tcu::TEXTURECHANNELCLASS_UNSIGNED_INTEGER);
	DE_UNREF(channelClass);

	for (int c = 0; c < 4; c++)
	{
		const TextureSwizzle::Channel map = channelMap[c];
		if (map == TextureSwizzle::CHANNEL_ZERO)
			result[c] = 0;
		else if (map == TextureSwizzle::CHANNEL_ONE)
			result[c] = 1;
		else
		{
			// integer values are clamped to a representable range
			result[c] = de::min(sampler.borderColor.getAccess<deUint32>()[(int)map], valueMax[(int)map]);
		}
	}

	return result;
}